

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O1

void __thiscall disp::hg(disp *this,cmatch *m)

{
  undefined8 *puVar1;
  bool bVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60 [16];
  long *local_50;
  ulong local_48;
  long local_40;
  long lStack_38;
  
  if (((int)((ulong)(*(long *)(m + 0x18) - (long)*(int **)(m + 0x10)) >> 3) < 1) ||
     (**(int **)(m + 0x10) == -1)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  local_70 = local_60;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70);
  }
  else {
    local_68 = 0;
    local_60[0] = 0;
  }
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x134d61);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_a0 = *puVar6;
    uStack_98 = (undefined4)plVar3[3];
    uStack_94 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  lVar7 = *(long *)(m + 0x10);
  if (((int)((ulong)(*(long *)(m + 0x18) - lVar7) >> 3) < 2) || ((long)*(int *)(lVar7 + 8) == -1)) {
    lVar8 = 0;
    lVar7 = 0;
    bVar2 = false;
  }
  else {
    lVar8 = (long)*(int *)(lVar7 + 8) + *(long *)m;
    lVar7 = (long)*(int *)(lVar7 + 0xc) + *(long *)m;
    bVar2 = true;
  }
  local_d0 = &local_c0;
  if (bVar2) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,lVar8,lVar7);
  }
  else {
    local_c8 = 0;
    local_c0 = 0;
  }
  uVar9 = 0xf;
  if (local_b0 != &local_a0) {
    uVar9 = local_a0;
  }
  if (uVar9 < (ulong)(local_c8 + local_a8)) {
    uVar9 = 0xf;
    if (local_d0 != &local_c0) {
      uVar9 = CONCAT71(uStack_bf,local_c0);
    }
    if ((ulong)(local_c8 + local_a8) <= uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00125537;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_d0);
LAB_00125537:
  local_90 = &local_80;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar4[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar4;
  }
  local_88 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_90);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void hg(booster::cmatch const &m)
	{ v_ = "m:" + std::string(m[0]) +':'+std::string(m[1]); }